

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_test.c
# Opt level: O0

int test_yajl_map_key(void *ctx,uchar *stringVal,size_t stringLen)

{
  void *__dest;
  size_t in_RDX;
  void *in_RSI;
  char *str;
  
  __dest = malloc(in_RDX + 1);
  *(undefined1 *)((long)__dest + in_RDX) = 0;
  memcpy(__dest,in_RSI,in_RDX);
  printf("key: \'%s\'\n",__dest);
  free(__dest);
  return 1;
}

Assistant:

static int test_yajl_map_key(void *ctx, const unsigned char * stringVal,
                             size_t stringLen)
{
    char * str = (char *) malloc(stringLen + 1);
    str[stringLen] = 0;
    memcpy(str, stringVal, stringLen);
    printf("key: '%s'\n", str);
    free(str);
    return 1;
}